

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O1

shared_ptr<embree::Texture> __thiscall
embree::XMLLoader::loadTextureParm(XMLLoader *this,Ref<embree::XML> *xml)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  XML *pXVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  _Alloc_hider _Var4;
  size_type sVar5;
  undefined1 auVar6 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  int iVar8;
  Format format;
  uint uVar9;
  iterator iVar10;
  mapped_type *pmVar11;
  int *piVar12;
  long lVar13;
  long lVar14;
  Texture *this_00;
  ulong uVar15;
  runtime_error *prVar16;
  undefined8 *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var17;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  uint uVar18;
  shared_ptr<embree::Texture> sVar19;
  FileName src;
  string id;
  string local_d8;
  undefined1 local_b8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_b0;
  char local_a8 [28];
  int local_8c;
  undefined1 local_88 [8];
  string local_80;
  long local_60;
  string local_58;
  pointer local_38;
  
  pXVar2 = (XML *)*in_RDX;
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_88 + 8),"id","");
  XML::parm(&local_58,pXVar2,(string *)(local_88 + 8));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  iVar8 = std::__cxx11::string::compare((char *)&local_58);
  if (iVar8 != 0) {
    iVar10 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>_>_>
             ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>_>_>
                     *)&((xml[10].ptr)->children).
                        super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_58);
    if (iVar10._M_node != (_Base_ptr)&(xml[10].ptr)->body) {
      pmVar11 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>_>_>
                              *)&((xml[10].ptr)->children).
                                 super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_58);
      (this->path).filename._M_dataplus._M_p =
           (pointer)(pmVar11->super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr;
      p_Var3 = (pmVar11->super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
      (this->path).filename._M_string_length = (size_type)p_Var3;
      _Var17._M_pi = extraout_RDX;
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        }
      }
      goto LAB_0017f5d5;
    }
  }
  (this->path).filename._M_dataplus._M_p = (pointer)0x0;
  (this->path).filename._M_string_length = 0;
  pXVar2 = (XML *)*in_RDX;
  local_b8 = (undefined1  [8])local_a8;
  local_88 = (undefined1  [8])this;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"src","");
  XML::parm(&local_d8,pXVar2,(string *)local_b8);
  FileName::FileName((FileName *)(local_88 + 8),&local_d8);
  paVar1 = &local_d8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  if (local_b8 != (undefined1  [8])local_a8) {
    operator_delete((void *)local_b8);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d8,local_80._M_dataplus._M_p,
             local_80._M_string_length + (long)local_80._M_dataplus._M_p);
  iVar8 = std::__cxx11::string::compare((char *)&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  this = (XMLLoader *)local_88;
  if (iVar8 != 0) {
    FileName::operator+((FileName *)&local_d8,(FileName *)xml,(FileName *)(local_88 + 8));
    Texture::load((Texture *)local_b8,(FileName *)&local_d8);
    p_Var7 = p_Stack_b0;
    auVar6 = local_b8;
    local_b8 = (undefined1  [8])0x0;
    p_Stack_b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var3 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)this + 8);
    *(undefined1 (*) [8])this = auVar6;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)this + 8) = p_Var7;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    if (p_Stack_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_b0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar1) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
LAB_0017f57b:
    iVar8 = std::__cxx11::string::compare((char *)&local_58);
    _Var17._M_pi = extraout_RDX_00;
    if (iVar8 != 0) {
      pmVar11 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>_>_>
                              *)&((xml[10].ptr)->children).
                                 super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_58);
      (pmVar11->super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
           (element_type *)(this->path).filename._M_dataplus._M_p;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(pmVar11->super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount,
                 (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &(this->path).filename._M_string_length);
      _Var17._M_pi = extraout_RDX_01;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p);
      _Var17._M_pi = extraout_RDX_02;
    }
LAB_0017f5d5:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
      _Var17._M_pi = extraout_RDX_03;
    }
    sVar19.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var17._M_pi;
    sVar19.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<embree::Texture>)
           sVar19.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>;
  }
  pXVar2 = (XML *)*in_RDX;
  local_b8 = (undefined1  [8])local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"width","");
  XML::parm(&local_d8,pXVar2,(string *)local_b8);
  _Var4._M_p = local_d8._M_dataplus._M_p;
  piVar12 = __errno_location();
  iVar8 = *piVar12;
  *piVar12 = 0;
  lVar13 = strtol(_Var4._M_p,&local_38,10);
  if (local_38 == _Var4._M_p) {
    std::__throw_invalid_argument("stoi");
LAB_0017f612:
    std::__throw_out_of_range("stoi");
LAB_0017f61e:
    std::__throw_invalid_argument("stoi");
  }
  else {
    local_60 = lVar13;
    if (((int)lVar13 != lVar13) || (*piVar12 == 0x22)) goto LAB_0017f612;
    if (*piVar12 == 0) {
      *piVar12 = iVar8;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
    if (local_b8 != (undefined1  [8])local_a8) {
      operator_delete((void *)local_b8);
    }
    pXVar2 = (XML *)*in_RDX;
    local_b8 = (undefined1  [8])local_a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"height","");
    XML::parm(&local_d8,pXVar2,(string *)local_b8);
    _Var4._M_p = local_d8._M_dataplus._M_p;
    local_8c = *piVar12;
    *piVar12 = 0;
    lVar13 = strtol(local_d8._M_dataplus._M_p,&local_38,10);
    if (local_38 == _Var4._M_p) goto LAB_0017f61e;
    if ((0xfffffffeffffffff < lVar13 - 0x80000000U) && (*piVar12 != 0x22)) {
      if (*piVar12 == 0) {
        *piVar12 = local_8c;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p);
      }
      if (local_b8 != (undefined1  [8])local_a8) {
        operator_delete((void *)local_b8);
      }
      pXVar2 = (XML *)*in_RDX;
      local_b8 = (undefined1  [8])local_a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"format","");
      XML::parm(&local_d8,pXVar2,(string *)local_b8);
      format = Texture::string_to_format(&local_d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p);
      }
      if (local_b8 != (undefined1  [8])local_a8) {
        operator_delete((void *)local_b8);
      }
      uVar9 = Texture::getFormatBytesPerTexel(format);
      lVar14 = ftell((FILE *)xml[4].ptr);
      uVar18 = (uint)lVar13 * (int)local_60;
      if ((long)(ulong)*(uint *)&xml[9].ptr < (long)((ulong)(uVar9 * uVar18) + lVar14))
      goto LAB_0017f636;
      this_00 = (Texture *)alignedUSMMalloc(0x40,0x10,DEVICE_READ_ONLY);
      Texture::Texture(this_00,(uint)local_60,(uint)lVar13,format,(char *)0x0);
      local_d8._M_dataplus._M_p = (pointer)this_00;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<embree::Texture*>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_d8._M_string_length,this_00);
      sVar5 = local_d8._M_string_length;
      _Var4._M_p = local_d8._M_dataplus._M_p;
      local_d8._M_dataplus._M_p = (pointer)0x0;
      local_d8._M_string_length = 0;
      p_Var3 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_88 + 8);
      *(pointer *)local_88 = _Var4._M_p;
      *(size_type *)((long)local_88 + 8) = sVar5;
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._M_string_length);
      }
      this = (XMLLoader *)local_88;
      uVar15 = __fread_chk(*(undefined8 *)(*(long *)local_88 + 0x18),0xffffffffffffffff,uVar9,
                           (ulong)uVar18,xml[4].ptr);
      if (uVar15 != uVar18) {
        prVar16 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_b8 = (undefined1  [8])local_a8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_b8,xml[5].ptr,
                   (long)&((xml[6].ptr)->super_RefCount)._vptr_RefCount +
                   (long)&((xml[5].ptr)->super_RefCount)._vptr_RefCount);
        std::operator+(&local_d8,"error reading from binary file: ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8
                      );
        std::runtime_error::runtime_error(prVar16,(string *)&local_d8);
        __cxa_throw(prVar16,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_0017f57b;
    }
  }
  std::__throw_out_of_range("stoi");
LAB_0017f636:
  prVar16 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_b8 = (undefined1  [8])local_a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_b8,xml[5].ptr,
             (long)&((xml[6].ptr)->super_RefCount)._vptr_RefCount +
             (long)&((xml[5].ptr)->super_RefCount)._vptr_RefCount);
  std::operator+(&local_d8,"error reading from binary file: ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8);
  std::runtime_error::runtime_error(prVar16,(string *)&local_d8);
  __cxa_throw(prVar16,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::shared_ptr<Texture> XMLLoader::loadTextureParm(const Ref<XML>& xml)
  {
    const std::string id = xml->parm("id");
    if (id != "" && state.textureMap.find(id) != state.textureMap.end())
      return state.textureMap[id];

    std::shared_ptr<Texture> texture;
    const FileName src = xml->parm("src");

    /*! load texture from file */
    if (src.str() != "") {
      texture = Texture::load(path+src);
    }

    /*! load texture from binary file */
    else {
      const unsigned width  = stoi(xml->parm("width"));
      const unsigned height = stoi(xml->parm("height"));
      const Texture::Format format = Texture::string_to_format(xml->parm("format"));
      const unsigned bytesPerTexel = Texture::getFormatBytesPerTexel(format);
      if (ftell(binFile) + width*height*bytesPerTexel > (unsigned)binFileSize)
        THROW_RUNTIME_ERROR("error reading from binary file: "+binFileName.str());
      
      //texture = std::make_shared<Texture>(width,height,format);
      texture = std::shared_ptr<Texture>(new Texture(width,height,format));
      if (width*height != fread(texture->data, bytesPerTexel, width*height, binFile)) 
        THROW_RUNTIME_ERROR("error reading from binary file: "+binFileName.str());
    }
    
    if (id != "") state.textureMap[id] = texture;
    return texture;
  }